

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::MapPair(MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_first)

{
  pointer pcVar1;
  
  (this->first)._M_dataplus._M_p = (pointer)&(this->first).field_2;
  pcVar1 = (other_first->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + other_first->_M_string_length);
  (this->second).super_Message.super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->second).super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__Value_003c7cc0;
  (this->second)._cached_size_.size_.super___atomic_base<int>._M_i = 0;
  if (scc_info_ListValue_google_2fprotobuf_2fstruct_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_ListValue_google_2fprotobuf_2fstruct_2eproto.base);
  }
  (this->second)._oneof_case_[0] = 0;
  return;
}

Assistant:

explicit MapPair(const Key& other_first) : first(other_first), second() {}